

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O3

void __thiscall leveldb::FindFileTest_Single_Test::TestBody(FindFileTest_Single_Test *this)

{
  char cVar1;
  size_type sVar2;
  bool bVar3;
  int line;
  char *pcVar4;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_60;
  AssertionResult local_58;
  AssertHelper local_48;
  string local_40;
  
  FindFileTest::Add(&this->super_FindFileTest,"p","q",100,100);
  local_58.success_ = false;
  local_58._1_3_ = 0;
  local_60.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"a");
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_40,"0","Find(\"a\")",(int *)&local_58,(int *)&local_60);
  cVar1 = (char)local_40._M_dataplus._M_p;
  if ((char)local_40._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_40._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
               ,0x40,pcVar4);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)CONCAT44(local_58._4_4_,local_58._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_58._4_4_,local_58._0_4_) + 8))();
    }
  }
  sVar2 = local_40._M_string_length;
  if ((undefined8 *)local_40._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_40._M_string_length !=
        (undefined8 *)(local_40._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_40._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  if (cVar1 == '\0') {
    return;
  }
  local_58.success_ = false;
  local_58._1_3_ = 0;
  local_60.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"p");
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_40,"0","Find(\"p\")",(int *)&local_58,(int *)&local_60);
  cVar1 = (char)local_40._M_dataplus._M_p;
  if ((char)local_40._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_40._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
               ,0x41,pcVar4);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)CONCAT44(local_58._4_4_,local_58._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_58._4_4_,local_58._0_4_) + 8))();
    }
  }
  sVar2 = local_40._M_string_length;
  if ((undefined8 *)local_40._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_40._M_string_length !=
        (undefined8 *)(local_40._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_40._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  if (cVar1 == '\0') {
    return;
  }
  local_58.success_ = false;
  local_58._1_3_ = 0;
  local_60.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"p1");
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_40,"0","Find(\"p1\")",(int *)&local_58,(int *)&local_60);
  cVar1 = (char)local_40._M_dataplus._M_p;
  if ((char)local_40._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_40._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
               ,0x42,pcVar4);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)CONCAT44(local_58._4_4_,local_58._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_58._4_4_,local_58._0_4_) + 8))();
    }
  }
  sVar2 = local_40._M_string_length;
  if ((undefined8 *)local_40._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_40._M_string_length !=
        (undefined8 *)(local_40._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_40._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  if (cVar1 == '\0') {
    return;
  }
  local_58.success_ = false;
  local_58._1_3_ = 0;
  local_60.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"q");
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_40,"0","Find(\"q\")",(int *)&local_58,(int *)&local_60);
  cVar1 = (char)local_40._M_dataplus._M_p;
  if ((char)local_40._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_40._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
               ,0x43,pcVar4);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)CONCAT44(local_58._4_4_,local_58._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_58._4_4_,local_58._0_4_) + 8))();
    }
  }
  sVar2 = local_40._M_string_length;
  if ((undefined8 *)local_40._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_40._M_string_length !=
        (undefined8 *)(local_40._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_40._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  if (cVar1 == '\0') {
    return;
  }
  local_58.success_ = true;
  local_58._1_3_ = 0;
  local_60.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"q1");
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_40,"1","Find(\"q1\")",(int *)&local_58,(int *)&local_60);
  cVar1 = (char)local_40._M_dataplus._M_p;
  if ((char)local_40._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_40._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
               ,0x44,pcVar4);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)CONCAT44(local_58._4_4_,local_58._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_58._4_4_,local_58._0_4_) + 8))();
    }
  }
  sVar2 = local_40._M_string_length;
  if ((undefined8 *)local_40._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_40._M_string_length !=
        (undefined8 *)(local_40._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_40._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  if (cVar1 == '\0') {
    return;
  }
  local_58.success_ = true;
  local_58._1_3_ = 0;
  local_60.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"z");
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_40,"1","Find(\"z\")",(int *)&local_58,(int *)&local_60);
  cVar1 = (char)local_40._M_dataplus._M_p;
  if ((char)local_40._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_40._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
               ,0x45,pcVar4);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)CONCAT44(local_58._4_4_,local_58._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_58._4_4_,local_58._0_4_) + 8))();
    }
  }
  if ((undefined8 *)local_40._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_40._M_string_length !=
        (undefined8 *)(local_40._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_40._M_string_length);
    }
    operator_delete((void *)local_40._M_string_length);
  }
  if (cVar1 == '\0') {
    return;
  }
  bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"a","b");
  bVar3 = !bVar3;
  local_58.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_58.success_ = bVar3;
  if (bVar3) {
    testing::AssertionResult::~AssertionResult(&local_58);
    local_58.success_ = FindFileTest::Overlaps(&this->super_FindFileTest,"z1","z2");
    local_58.success_ = !local_58.success_;
    local_58.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (local_58.success_) {
      testing::AssertionResult::~AssertionResult(&local_58);
      local_58.success_ = FindFileTest::Overlaps(&this->super_FindFileTest,"a","p");
      local_58.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (local_58.success_) {
        testing::AssertionResult::~AssertionResult(&local_58);
        local_58.success_ = FindFileTest::Overlaps(&this->super_FindFileTest,"a","q");
        local_58.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (local_58.success_) {
          testing::AssertionResult::~AssertionResult(&local_58);
          local_58.success_ = FindFileTest::Overlaps(&this->super_FindFileTest,"a","z");
          local_58.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (local_58.success_) {
            testing::AssertionResult::~AssertionResult(&local_58);
            local_58.success_ = FindFileTest::Overlaps(&this->super_FindFileTest,"p","p1");
            local_58.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            if (local_58.success_) {
              testing::AssertionResult::~AssertionResult(&local_58);
              local_58.success_ = FindFileTest::Overlaps(&this->super_FindFileTest,"p","q");
              local_58.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              if (local_58.success_) {
                testing::AssertionResult::~AssertionResult(&local_58);
                local_58.success_ = FindFileTest::Overlaps(&this->super_FindFileTest,"p","z");
                local_58.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                if (local_58.success_) {
                  testing::AssertionResult::~AssertionResult(&local_58);
                  local_58.success_ = FindFileTest::Overlaps(&this->super_FindFileTest,"p1","p2");
                  local_58.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  if (local_58.success_) {
                    testing::AssertionResult::~AssertionResult(&local_58);
                    local_58.success_ = FindFileTest::Overlaps(&this->super_FindFileTest,"p1","z");
                    local_58.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )0x0;
                    if (local_58.success_) {
                      testing::AssertionResult::~AssertionResult(&local_58);
                      local_58.success_ = FindFileTest::Overlaps(&this->super_FindFileTest,"q","q");
                      local_58.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )0x0;
                      if (local_58.success_) {
                        testing::AssertionResult::~AssertionResult(&local_58);
                        local_58.success_ =
                             FindFileTest::Overlaps(&this->super_FindFileTest,"q","q1");
                        local_58.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl =
                             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )0x0;
                        if (local_58.success_) {
                          testing::AssertionResult::~AssertionResult(&local_58);
                          local_58.success_ =
                               FindFileTest::Overlaps(&this->super_FindFileTest,(char *)0x0,"j");
                          local_58.success_ = !local_58.success_;
                          local_58.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl =
                               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )0x0;
                          if (local_58.success_) {
                            testing::AssertionResult::~AssertionResult(&local_58);
                            local_58.success_ =
                                 FindFileTest::Overlaps(&this->super_FindFileTest,"r",(char *)0x0);
                            local_58.success_ = !local_58.success_;
                            local_58.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl =
                                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )0x0;
                            if (local_58.success_) {
                              testing::AssertionResult::~AssertionResult(&local_58);
                              local_58.success_ =
                                   FindFileTest::Overlaps(&this->super_FindFileTest,(char *)0x0,"p")
                              ;
                              local_58.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl =
                                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )0x0;
                              if (local_58.success_) {
                                testing::AssertionResult::~AssertionResult(&local_58);
                                local_58.success_ =
                                     FindFileTest::Overlaps
                                               (&this->super_FindFileTest,(char *)0x0,"p1");
                                local_58.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl =
                                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )0x0;
                                if (local_58.success_) {
                                  testing::AssertionResult::~AssertionResult(&local_58);
                                  local_58.success_ =
                                       FindFileTest::Overlaps
                                                 (&this->super_FindFileTest,"q",(char *)0x0);
                                  local_58.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl =
                                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )0x0;
                                  if (local_58.success_) {
                                    testing::AssertionResult::~AssertionResult(&local_58);
                                    local_58.success_ =
                                         FindFileTest::Overlaps
                                                   (&this->super_FindFileTest,(char *)0x0,
                                                    (char *)0x0);
                                    local_58.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl =
                                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )0x0;
                                    if (local_58.success_) goto LAB_0010c37e;
                                    testing::Message::Message((Message *)&local_60);
                                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                              (&local_40,(internal *)&local_58,
                                               (AssertionResult *)0x148114,"false","true",in_R9);
                                    pcVar4 = (char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                                              (char)local_40._M_dataplus._M_p);
                                    line = 0x59;
                                  }
                                  else {
                                    testing::Message::Message((Message *)&local_60);
                                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                              (&local_40,(internal *)&local_58,
                                               (AssertionResult *)"Overlaps(\"q\", nullptr)","false"
                                               ,"true",in_R9);
                                    pcVar4 = (char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                                              (char)local_40._M_dataplus._M_p);
                                    line = 0x58;
                                  }
                                }
                                else {
                                  testing::Message::Message((Message *)&local_60);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            (&local_40,(internal *)&local_58,
                                             (AssertionResult *)"Overlaps(nullptr, \"p1\")","false",
                                             "true",in_R9);
                                  pcVar4 = (char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                                            (char)local_40._M_dataplus._M_p);
                                  line = 0x57;
                                }
                              }
                              else {
                                testing::Message::Message((Message *)&local_60);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          (&local_40,(internal *)&local_58,
                                           (AssertionResult *)"Overlaps(nullptr, \"p\")","false",
                                           "true",in_R9);
                                pcVar4 = (char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                                          (char)local_40._M_dataplus._M_p);
                                line = 0x56;
                              }
                            }
                            else {
                              testing::Message::Message((Message *)&local_60);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        (&local_40,(internal *)&local_58,
                                         (AssertionResult *)"!Overlaps(\"r\", nullptr)","false",
                                         "true",in_R9);
                              pcVar4 = (char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                                        (char)local_40._M_dataplus._M_p);
                              line = 0x55;
                            }
                          }
                          else {
                            testing::Message::Message((Message *)&local_60);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      (&local_40,(internal *)&local_58,
                                       (AssertionResult *)"!Overlaps(nullptr, \"j\")","false","true"
                                       ,in_R9);
                            pcVar4 = (char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                                      (char)local_40._M_dataplus._M_p);
                            line = 0x54;
                          }
                        }
                        else {
                          testing::Message::Message((Message *)&local_60);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    (&local_40,(internal *)&local_58,
                                     (AssertionResult *)"Overlaps(\"q\", \"q1\")","false","true",
                                     in_R9);
                          pcVar4 = (char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                                    (char)local_40._M_dataplus._M_p);
                          line = 0x52;
                        }
                      }
                      else {
                        testing::Message::Message((Message *)&local_60);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  (&local_40,(internal *)&local_58,
                                   (AssertionResult *)"Overlaps(\"q\", \"q\")","false","true",in_R9)
                        ;
                        pcVar4 = (char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                                  (char)local_40._M_dataplus._M_p);
                        line = 0x51;
                      }
                    }
                    else {
                      testing::Message::Message((Message *)&local_60);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                (&local_40,(internal *)&local_58,
                                 (AssertionResult *)"Overlaps(\"p1\", \"z\")","false","true",in_R9);
                      pcVar4 = (char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                                (char)local_40._M_dataplus._M_p);
                      line = 0x50;
                    }
                  }
                  else {
                    testing::Message::Message((Message *)&local_60);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&local_40,(internal *)&local_58,
                               (AssertionResult *)"Overlaps(\"p1\", \"p2\")","false","true",in_R9);
                    pcVar4 = (char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                              (char)local_40._M_dataplus._M_p);
                    line = 0x4f;
                  }
                }
                else {
                  testing::Message::Message((Message *)&local_60);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_40,(internal *)&local_58,
                             (AssertionResult *)"Overlaps(\"p\", \"z\")","false","true",in_R9);
                  pcVar4 = (char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                            (char)local_40._M_dataplus._M_p);
                  line = 0x4e;
                }
              }
              else {
                testing::Message::Message((Message *)&local_60);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_40,(internal *)&local_58,
                           (AssertionResult *)"Overlaps(\"p\", \"q\")","false","true",in_R9);
                pcVar4 = (char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                          (char)local_40._M_dataplus._M_p);
                line = 0x4d;
              }
            }
            else {
              testing::Message::Message((Message *)&local_60);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_40,(internal *)&local_58,
                         (AssertionResult *)"Overlaps(\"p\", \"p1\")","false","true",in_R9);
              pcVar4 = (char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                        (char)local_40._M_dataplus._M_p);
              line = 0x4c;
            }
          }
          else {
            testing::Message::Message((Message *)&local_60);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_40,(internal *)&local_58,(AssertionResult *)0x1480c5,"false","true",
                       in_R9);
            pcVar4 = (char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                      (char)local_40._M_dataplus._M_p);
            line = 0x4b;
          }
        }
        else {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_40,(internal *)&local_58,(AssertionResult *)"Overlaps(\"a\", \"q\")",
                     "false","true",in_R9);
          pcVar4 = (char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,(char)local_40._M_dataplus._M_p)
          ;
          line = 0x4a;
        }
      }
      else {
        testing::Message::Message((Message *)&local_60);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_40,(internal *)&local_58,(AssertionResult *)"Overlaps(\"a\", \"p\")",
                   "false","true",in_R9);
        pcVar4 = (char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,(char)local_40._M_dataplus._M_p);
        line = 0x49;
      }
    }
    else {
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_40,(internal *)&local_58,(AssertionResult *)"!Overlaps(\"z1\", \"z2\")",
                 "false","true",in_R9);
      pcVar4 = (char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,(char)local_40._M_dataplus._M_p);
      line = 0x48;
    }
  }
  else {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&local_58,(AssertionResult *)"!Overlaps(\"a\", \"b\")","false",
               "true",in_R9);
    pcVar4 = (char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,(char)local_40._M_dataplus._M_p);
    line = 0x47;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_48,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
             ,line,pcVar4);
  testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_60);
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_40._M_dataplus._M_p._1_7_,(char)local_40._M_dataplus._M_p) !=
      &local_40.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_40._M_dataplus._M_p._1_7_,(char)local_40._M_dataplus._M_p));
  }
  if ((long *)CONCAT44(local_60.data_._4_4_,(int)local_60.data_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_60.data_._4_4_,(int)local_60.data_) + 8))();
  }
LAB_0010c37e:
  testing::AssertionResult::~AssertionResult(&local_58);
  return;
}

Assistant:

TEST_F(FindFileTest, Single) {
  Add("p", "q");
  ASSERT_EQ(0, Find("a"));
  ASSERT_EQ(0, Find("p"));
  ASSERT_EQ(0, Find("p1"));
  ASSERT_EQ(0, Find("q"));
  ASSERT_EQ(1, Find("q1"));
  ASSERT_EQ(1, Find("z"));

  ASSERT_TRUE(!Overlaps("a", "b"));
  ASSERT_TRUE(!Overlaps("z1", "z2"));
  ASSERT_TRUE(Overlaps("a", "p"));
  ASSERT_TRUE(Overlaps("a", "q"));
  ASSERT_TRUE(Overlaps("a", "z"));
  ASSERT_TRUE(Overlaps("p", "p1"));
  ASSERT_TRUE(Overlaps("p", "q"));
  ASSERT_TRUE(Overlaps("p", "z"));
  ASSERT_TRUE(Overlaps("p1", "p2"));
  ASSERT_TRUE(Overlaps("p1", "z"));
  ASSERT_TRUE(Overlaps("q", "q"));
  ASSERT_TRUE(Overlaps("q", "q1"));

  ASSERT_TRUE(!Overlaps(nullptr, "j"));
  ASSERT_TRUE(!Overlaps("r", nullptr));
  ASSERT_TRUE(Overlaps(nullptr, "p"));
  ASSERT_TRUE(Overlaps(nullptr, "p1"));
  ASSERT_TRUE(Overlaps("q", nullptr));
  ASSERT_TRUE(Overlaps(nullptr, nullptr));
}